

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseMemoryInstrVar<wabt::MemoryVarExpr<(wabt::ExprType)32>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  bool bVar1;
  MemoryVarExpr<(wabt::ExprType)32> *pMVar2;
  Var local_248;
  Var local_200;
  size_t local_1b8;
  char *local_1b0;
  size_t local_1a8;
  undefined8 local_1a0;
  Var local_198;
  Enum local_14c;
  Var local_148;
  Enum local_fc;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  undefined8 local_e0;
  Enum local_d8;
  undefined4 local_d4;
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  Var var;
  Var memidx;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  Var::Var((Var *)((long)&var.field_2 + 0x18));
  Var::Var((Var *)local_b0);
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    bVar1 = Features::multi_memory_enabled(&this->options_->features);
    if (!bVar1) {
      local_d0 = loc.filename._M_len;
      local_c8 = loc.filename._M_str;
      local_c0 = (size_t)loc.field_1.field_1.offset;
      local_b8 = loc.field_1._8_8_;
      Error(this,0x2bc802);
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0021bea0;
    }
    local_f8 = loc.filename._M_len;
    local_f0 = loc.filename._M_str;
    local_e8 = (size_t)loc.field_1.field_1.offset;
    local_e0 = loc.field_1._8_8_;
    local_d8 = (Enum)ParseMemidx(this,loc,(Var *)((long)&var.field_2 + 0x18));
    bVar1 = Failed((Result)local_d8);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0021bea0;
    }
    local_fc = (Enum)ParseVar(this,(Var *)local_b0);
    bVar1 = Failed((Result)local_fc);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0021bea0;
    }
    pMVar2 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
    Var::Var(&local_148,(Var *)((long)&var.field_2 + 0x18));
    MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr(pMVar2,(Var *)local_b0,&local_148,&loc);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset(out_expr,(pointer)pMVar2);
    Var::~Var(&local_148);
  }
  else {
    local_14c = (Enum)ParseVar(this,(Var *)((long)&var.field_2 + 0x18));
    bVar1 = Failed((Result)local_14c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0021bea0;
    }
    Var::Var(&local_198,0,&loc);
    bVar1 = ParseVarOpt(this,(Var *)local_b0,&local_198);
    Var::~Var(&local_198);
    if (bVar1) {
      bVar1 = Features::multi_memory_enabled(&this->options_->features);
      if (!bVar1) {
        local_1b8 = loc.filename._M_len;
        local_1b0 = loc.filename._M_str;
        local_1a8 = (size_t)loc.field_1.field_1.offset;
        local_1a0 = loc.field_1._8_8_;
        Error(this,0x2bdcb1);
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_0021bea0;
      }
      pMVar2 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
      Var::Var(&local_200,(Var *)((long)&var.field_2 + 0x18));
      MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr(pMVar2,(Var *)local_b0,&local_200,&loc);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset(out_expr,(pointer)pMVar2)
      ;
      Var::~Var(&local_200);
    }
    else {
      pMVar2 = (MemoryVarExpr<(wabt::ExprType)32> *)operator_new(0xd0);
      Var::Var(&local_248,(Var *)local_b0);
      MemoryVarExpr<(wabt::ExprType)32>::MemoryVarExpr
                (pMVar2,(Var *)((long)&var.field_2 + 0x18),&local_248,&loc);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset(out_expr,(pointer)pMVar2)
      ;
      Var::~Var(&local_248);
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
LAB_0021bea0:
  local_d4 = 1;
  Var::~Var((Var *)local_b0);
  Var::~Var((Var *)((long)&var.field_2 + 0x18));
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemoryInstrVar(Location loc,
                                       std::unique_ptr<Expr>* out_expr) {
  Var memidx;
  Var var;
  if (PeekMatchLpar(TokenType::Memory)) {
    if (!options_->features.multi_memory_enabled()) {
      Error(loc, "Specifying memory variable is not allowed");
      return Result::Error;
    }
    CHECK_RESULT(ParseMemidx(loc, &memidx));
    CHECK_RESULT(ParseVar(&var));
    out_expr->reset(new T(var, memidx, loc));
  } else {
    CHECK_RESULT(ParseVar(&memidx));
    if (ParseVarOpt(&var, Var(0, loc))) {
      if (!options_->features.multi_memory_enabled()) {
        Error(loc, "Specifiying memory variable is not allowed");
        return Result::Error;
      }
      out_expr->reset(new T(var, memidx, loc));
    } else {
      out_expr->reset(new T(memidx, var, loc));
    }
  }
  return Result::Ok;
}